

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::NegativeBindVertexBuffer::Run(NegativeBindVertexBuffer *this)

{
  GLenum GVar1;
  int local_1c;
  NegativeBindVertexBuffer *pNStack_18;
  GLint p;
  NegativeBindVertexBuffer *this_local;
  
  pNStack_18 = this;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,1000,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0x4d2,0,0xc);
  GVar1 = glu::CallLogWrapper::glGetError
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  if (GVar1 == 0x502) {
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x82da,&local_1c);
    glu::CallLogWrapper::glBindVertexBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,local_1c + 1,this->m_vbo,0,0xc);
    GVar1 = glu::CallLogWrapper::glGetError
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar1 == 0x501) {
      glu::CallLogWrapper::glBindVertexBuffer
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,this->m_vbo,-10,0xc);
      GVar1 = glu::CallLogWrapper::glGetError
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper);
      if (GVar1 == 0x501) {
        glu::CallLogWrapper::glBindVertexBuffer
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,this->m_vbo,0,-0xc);
        GVar1 = glu::CallLogWrapper::glGetError
                          (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper);
        if (GVar1 == 0x501) {
          glu::CallLogWrapper::glBindVertexArray
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0);
          glu::CallLogWrapper::glBindVertexBuffer
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0,this->m_vbo,0,0xc);
          GVar1 = glu::CallLogWrapper::glGetError
                            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper);
          if (GVar1 == 0x502) {
            this_local = (NegativeBindVertexBuffer *)0x0;
          }
          else {
            anon_unknown_0::Output("INVALID_OPERATION should be generated.\n");
            this_local = (NegativeBindVertexBuffer *)&DAT_ffffffffffffffff;
          }
        }
        else {
          anon_unknown_0::Output("INVALID_VALUE should be generated.\n");
          this_local = (NegativeBindVertexBuffer *)&DAT_ffffffffffffffff;
        }
      }
      else {
        anon_unknown_0::Output("INVALID_VALUE should be generated.\n");
        this_local = (NegativeBindVertexBuffer *)&DAT_ffffffffffffffff;
      }
    }
    else {
      anon_unknown_0::Output("INVALID_VALUE should be generated.\n");
      this_local = (NegativeBindVertexBuffer *)&DAT_ffffffffffffffff;
    }
  }
  else {
    anon_unknown_0::Output("INVALID_OPERATION should be generated.\n");
    this_local = (NegativeBindVertexBuffer *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, 1000, NULL, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);

		glBindVertexBuffer(0, 1234, 0, 12);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}

		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &p);
		glBindVertexBuffer(p + 1, m_vbo, 0, 12);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}

		glBindVertexBuffer(0, m_vbo, -10, 12);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glBindVertexBuffer(0, m_vbo, 0, -12);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}

		glBindVertexArray(0);
		glBindVertexBuffer(0, m_vbo, 0, 12);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}

		return NO_ERROR;
	}